

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

void __thiscall cmDepends::Clear(cmDepends *this,char *file)

{
  size_t sVar1;
  cmGeneratedFileStream depFileStream;
  long *local_278 [2];
  long local_268 [2];
  undefined1 local_258 [584];
  
  if (this->Verbose == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258,"Clearing dependencies in \"",0x1a);
    if (file == (char *)0x0) {
      std::ios::clear((int)(_func_int *)
                           ((long)local_278 + (long)*(_func_int **)(local_258._0_8_ + -0x18)) + 0x20
                     );
    }
    else {
      sVar1 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,file,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_258,"\".",2);
    std::ios::widen((char)(ostream *)local_258 + (char)*(_func_int **)(local_258._0_8_ + -0x18));
    std::ostream::put((char)local_258);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((char *)local_278[0]);
    if (local_278[0] != local_268) {
      operator_delete(local_278[0],local_268[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    std::ios_base::~ios_base((ios_base *)(local_258 + 0x70));
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_258,file,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_258,"# Empty dependencies file\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_258,"# This may be replaced when dependencies are built.",0x33);
  std::ios::widen((char)(ostream *)local_258 + (char)*(_func_int **)(local_258._0_8_ + -0x18));
  std::ostream::put((char)local_258);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  return;
}

Assistant:

void cmDepends::Clear(const char* file)
{
  // Print verbose output.
  if (this->Verbose) {
    std::ostringstream msg;
    msg << "Clearing dependencies in \"" << file << "\"." << std::endl;
    cmSystemTools::Stdout(msg.str().c_str());
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                << "# This may be replaced when dependencies are built."
                << std::endl;
}